

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

int fromOffsetString(QStringView offsetString,bool *valid)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  QStringView *this;
  undefined1 *in_RDX;
  long in_FS_OFFSET;
  int minute;
  int hour;
  int sign;
  qsizetype size;
  QStringView mmRef;
  bool ok;
  QStringView hhRef;
  qsizetype mmIndex;
  qsizetype hhLen;
  QStringView time;
  QChar signChar;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  CaseSensitivity in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QStringView *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  QStringView *in_stack_ffffffffffffff50;
  int local_9c;
  QChar c;
  int local_84;
  qsizetype local_80;
  QStringView local_78;
  byte local_61;
  qsizetype local_60;
  QStringView local_58;
  longlong local_48;
  QChar local_3a;
  longlong local_38;
  QStringView local_30;
  QChar local_1e;
  QChar local_1c;
  char16_t local_1a;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDX = 0;
  qVar4 = QStringView::size(&local_18);
  if ((qVar4 < 2) || (6 < qVar4)) {
    local_84 = 0;
  }
  else {
    local_1a = 0xaaaa;
    local_1a = (char16_t)
               QStringView::operator[]
                         ((QStringView *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    c.ucs = (char16_t)((ulong)qVar4 >> 0x30);
    QChar::QChar<char16_t,_true>(&local_1c,L'+');
    bVar1 = operator==((QChar *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (QChar *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (bVar1) {
      local_9c = 1;
    }
    else {
      QChar::QChar<char16_t,_true>(&local_1e,L'-');
      bVar1 = operator==((QChar *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (QChar *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (!bVar1) {
        local_84 = 0;
        goto LAB_00574400;
      }
      local_9c = -1;
    }
    local_30.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QStringView::sliced(in_stack_ffffffffffffff50,
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QChar::QChar<char16_t,_true>(&local_3a,L':');
    local_38 = QStringView::indexOf
                         (in_stack_ffffffffffffff40,c,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          in_stack_ffffffffffffff34);
    if (local_38 == -1) {
      local_38 = 2;
      local_48 = 2;
    }
    else {
      local_48 = local_38 + 1;
    }
    local_58.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = QStringView::size(&local_30);
    this = (QStringView *)qMin<long_long>(&local_38,&local_60);
    local_58 = QStringView::first((QStringView *)
                                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                  0x5742d3);
    local_61 = 0;
    iVar2 = QStringView::toInt((QStringView *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (bool *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                               ,in_stack_ffffffffffffff2c);
    if (((local_61 & 1) == 0) || (0x17 < iVar2)) {
      local_84 = 0;
    }
    else {
      local_78.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      iVar3 = iVar2;
      local_80 = QStringView::size(&local_30);
      qMin<long_long>(&local_48,&local_80);
      local_78 = QStringView::sliced(this,CONCAT44(iVar3,in_stack_ffffffffffffff48));
      bVar1 = QStringView::isEmpty((QStringView *)0x574388);
      if (bVar1) {
        iVar3 = 0;
      }
      else {
        iVar3 = QStringView::toInt((QStringView *)
                                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                   (bool *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                   in_stack_ffffffffffffff2c);
      }
      if ((((local_61 & 1) == 0) || (iVar3 < 0)) || (0x3b < iVar3)) {
        local_84 = 0;
      }
      else {
        *in_RDX = 1;
        local_84 = local_9c * (iVar2 * 0x3c + iVar3) * 0x3c;
      }
    }
  }
LAB_00574400:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_84;
  }
  __stack_chk_fail();
}

Assistant:

static int fromOffsetString(QStringView offsetString, bool *valid) noexcept
{
    *valid = false;

    const qsizetype size = offsetString.size();
    if (size < 2 || size > 6)
        return 0;

    // sign will be +1 for a positive and -1 for a negative offset
    int sign;

    // First char must be + or -
    const QChar signChar = offsetString[0];
    if (signChar == u'+')
        sign = 1;
    else if (signChar == u'-')
        sign = -1;
    else
        return 0;

    // Split the hour and minute parts
    const QStringView time = offsetString.sliced(1);
    qsizetype hhLen = time.indexOf(u':');
    qsizetype mmIndex;
    if (hhLen == -1)
        mmIndex = hhLen = 2; // ±HHmm or ±HH format
    else
        mmIndex = hhLen + 1;

    const QStringView hhRef = time.first(qMin(hhLen, time.size()));
    bool ok = false;
    const int hour = hhRef.toInt(&ok);
    if (!ok || hour > 23) // More generous than QTimeZone::MaxUtcOffsetSecs
        return 0;

    const QStringView mmRef = time.sliced(qMin(mmIndex, time.size()));
    const int minute = mmRef.isEmpty() ? 0 : mmRef.toInt(&ok);
    if (!ok || minute < 0 || minute > 59)
        return 0;

    *valid = true;
    return sign * ((hour * 60) + minute) * 60;
}